

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uni2name.cpp
# Opt level: O0

void __thiscall
icu_63::UnicodeNameTransliterator::UnicodeNameTransliterator
          (UnicodeNameTransliterator *this,UnicodeFilter *adoptedFilter)

{
  ConstChar16Ptr local_60;
  UnicodeString local_58;
  UnicodeFilter *local_18;
  UnicodeFilter *adoptedFilter_local;
  UnicodeNameTransliterator *this_local;
  
  local_18 = adoptedFilter;
  adoptedFilter_local = (UnicodeFilter *)this;
  ConstChar16Ptr::ConstChar16Ptr(&local_60,L"Any-Name");
  icu_63::UnicodeString::UnicodeString(&local_58,'\x01',&local_60,8);
  Transliterator::Transliterator(&this->super_Transliterator,&local_58,local_18);
  icu_63::UnicodeString::~UnicodeString(&local_58);
  ConstChar16Ptr::~ConstChar16Ptr(&local_60);
  (this->super_Transliterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeNameTransliterator_005b9c18;
  return;
}

Assistant:

UnicodeNameTransliterator::UnicodeNameTransliterator(UnicodeFilter* adoptedFilter) :
    Transliterator(UNICODE_STRING("Any-Name", 8), adoptedFilter) {
}